

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O0

void despot::AEMS::Update(VNode *vnode)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *this;
  size_type sVar4;
  double *pdVar5;
  double dVar6;
  double local_40;
  double local_38;
  QNode *local_30;
  QNode *qnode;
  double dStack_20;
  ACT_TYPE action;
  double upper;
  double lower;
  VNode *vnode_local;
  
  lower = (double)vnode;
  bVar2 = VNode::IsLeaf(vnode);
  if (!bVar2) {
    upper = -INFINITY;
    dStack_20 = -INFINITY;
    qnode._4_4_ = 0;
    while( true ) {
      uVar3 = (ulong)qnode._4_4_;
      this = VNode::children((VNode *)lower);
      sVar4 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(this);
      dVar1 = upper;
      if (sVar4 <= uVar3) break;
      local_30 = VNode::Child((VNode *)lower,qnode._4_4_);
      local_38 = QNode::lower_bound(local_30);
      pdVar5 = std::max<double>(&upper,&local_38);
      upper = *pdVar5;
      local_40 = QNode::upper_bound(local_30);
      pdVar5 = std::max<double>(&stack0xffffffffffffffe0,&local_40);
      dStack_20 = *pdVar5;
      qnode._4_4_ = qnode._4_4_ + 1;
    }
    dVar6 = VNode::lower_bound((VNode *)lower);
    if (dVar6 < dVar1) {
      VNode::lower_bound((VNode *)lower,upper);
    }
    dVar1 = dStack_20;
    dVar6 = VNode::upper_bound((VNode *)lower);
    if (dVar1 < dVar6) {
      VNode::upper_bound((VNode *)lower,dStack_20);
    }
  }
  return;
}

Assistant:

void AEMS::Update(VNode* vnode) {
	if (vnode->IsLeaf())
		return;

	double lower = Globals::NEG_INFTY;
	double upper = Globals::NEG_INFTY;

	for (ACT_TYPE action = 0; action < vnode->children().size(); action++) {
		QNode* qnode = vnode->Child(action);

		lower = max(lower, qnode->lower_bound());
		upper = max(upper, qnode->upper_bound());
	}

	if (lower > vnode->lower_bound())
		vnode->lower_bound(lower);
	if (upper < vnode->upper_bound())
		vnode->upper_bound(upper);
}